

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
Initialize(SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
           *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  if (this->freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x18,"(this->freeObjectList == nullptr)","this->freeObjectList == nullptr");
    if (!bVar3) goto LAB_00294442;
    *puVar1 = 0;
  }
  if (this->endAddress != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x19,"(this->endAddress == nullptr)","this->endAddress == nullptr");
    if (!bVar3) goto LAB_00294442;
    *puVar1 = 0;
  }
  if (this->heapBlock != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x1a,"(this->heapBlock == nullptr)","this->heapBlock == nullptr");
    if (!bVar3) {
LAB_00294442:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  this->prev = this;
  this->next = this;
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::Initialize()
{
    Assert(this->freeObjectList == nullptr);
    Assert(this->endAddress == nullptr);
    Assert(this->heapBlock == nullptr);

    this->prev = this;
    this->next = this;

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = false);
#endif
}